

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

map_index_t __thiscall
google::protobuf::internal::UntypedMapBase::VariantBucketNumber(UntypedMapBase *this,VariantKey key)

{
  map_index_t local_3c;
  string_view local_30;
  UntypedMapBase *local_20;
  UntypedMapBase *this_local;
  VariantKey key_local;
  
  key_local.data = (char *)key.integral;
  this_local = (UntypedMapBase *)key.data;
  local_20 = this;
  if (this_local == (UntypedMapBase *)0x0) {
    local_3c = VariantBucketNumber(this,(uint64_t)key_local.data);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,(char *)this_local,(size_type)key_local.data);
    local_3c = VariantBucketNumber(this,local_30);
  }
  return local_3c;
}

Assistant:

map_index_t VariantBucketNumber(VariantKey key) const {
    return key.data == nullptr
               ? VariantBucketNumber(key.integral)
               : VariantBucketNumber(absl::string_view(
                     key.data, static_cast<size_t>(key.integral)));
  }